

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::makeARCopy(KktCheck *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  int iVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  int iPut;
  int iRow;
  int iCol;
  int AcountX;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type *in_stack_ffffffffffffff88;
  value_type vVar5;
  int in_stack_ffffffffffffff90;
  value_type in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  value_type vVar6;
  undefined4 in_stack_ffffffffffffff9c;
  vector<int,_std::allocator<int>_> *this_00;
  int local_40;
  undefined1 local_25 [37];
  
  in_RDI[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ee4f8b588e368f1;
  sVar1 = (size_type)
          *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start + 4);
  local_25._1_4_ = 0;
  this_00 = (vector<int,_std::allocator<int>_> *)local_25;
  std::allocator<int>::allocator((allocator<int> *)0x1bd0ad);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (value_type *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  std::allocator<int>::~allocator((allocator<int> *)0x1bd0d2);
  std::vector<int,_std::allocator<int>_>::resize(this_00,sVar1,(value_type *)in_RDI);
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<double,_std::allocator<double>_>::resize
            (in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *(undefined4 *)
   &in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = 0;
  while (*(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage < (int)sVar1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                        (long)*(int *)&in_RDI[0xb].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_25 + 5),(long)*pvVar2);
    *pvVar2 = *pvVar2 + 1;
    *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage =
         *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1;
  }
  *(undefined4 *)
   &in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = 1;
  while (*(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish <=
         *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + 4)) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                        (long)(*(int *)&in_RDI[0xb].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish + -1));
    vVar6 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_25 + 5),
                        (long)(*(int *)&in_RDI[0xb].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish + -1));
    iVar4 = vVar6 + *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                        (long)*(int *)&in_RDI[0xb].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish);
    *pvVar2 = iVar4;
    *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
         *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
  }
  *(undefined4 *)
   &in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  while (*(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish <
         *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + 4)) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                        (long)*(int *)&in_RDI[0xb].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish);
    in_stack_ffffffffffffff94 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_25 + 5),
                        (long)*(int *)&in_RDI[0xb].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish);
    *pvVar2 = in_stack_ffffffffffffff94;
    *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
         *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
  }
  for (local_40 = 0;
      local_40 <
      *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start; local_40 = local_40 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_40);
    *(value_type *)
     &in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *pvVar2;
    while( true ) {
      in_stack_ffffffffffffff90 =
           *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish,(long)(local_40 + 1));
      if (*pvVar2 <= in_stack_ffffffffffffff90) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                          (long)*(int *)&in_RDI[0xb].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_25 + 5),(long)*pvVar2);
      iVar4 = *pvVar2;
      *pvVar2 = iVar4 + 1;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)iVar4);
      *pvVar2 = local_40;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                          (long)*(int *)&in_RDI[0xb].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage);
      vVar5 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)iVar4);
      *pvVar3 = vVar5;
      *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage =
           *(int *)&in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void KktCheck::makeARCopy() {
	tol = 0.00001;
	// Make a AR copy
	vector<int> iwork(numRow, 0);
	ARstart.resize(numRow + 1, 0);
	int AcountX = Aindex.size();
	ARindex.resize(AcountX);
	ARvalue.resize(AcountX);
	for (k = 0; k < AcountX; k++)
	    iwork[Aindex[k]]++;
	for (i = 1; i <= numRow; i++)
	    ARstart[i] = ARstart[i - 1] + iwork[i - 1];
	for (i = 0; i < numRow; i++)
	    iwork[i] = ARstart[i];
	for (int iCol = 0; iCol < numCol; iCol++) {
	    for (k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	        int iRow = Aindex[k];
	        int iPut = iwork[iRow]++;
	        ARindex[iPut] = iCol;
	        ARvalue[iPut] = Avalue[k];
	    }
	}
}